

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O2

void test_bson_oid_init_with_threads(void)

{
  void *pvVar1;
  long lVar2;
  bson_context_t *contexts [4];
  pthread_t threads [4];
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    pvVar1 = (void *)bson_context_new(8);
    *(void **)((long)contexts + lVar2) = pvVar1;
    pthread_create((pthread_t *)((long)threads + lVar2),(pthread_attr_t *)0x0,oid_worker,pvVar1);
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pthread_join(threads[lVar2],(void **)0x0);
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    bson_context_destroy(contexts[lVar2]);
  }
  pvVar1 = (void *)bson_context_new(1);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    pthread_create((pthread_t *)((long)contexts + lVar2),(pthread_attr_t *)0x0,oid_worker,pvVar1);
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pthread_join((pthread_t)contexts[lVar2],(void **)0x0);
  }
  bson_context_destroy(pvVar1);
  return;
}

Assistant:

static void
test_bson_oid_init_with_threads (void)
{
   bson_context_t *context;
   int i;

   {
      bson_context_flags_t flags = BSON_CONTEXT_NONE;
      bson_context_t *contexts[N_THREADS];
      bson_thread_t threads[N_THREADS];

#ifdef BSON_HAVE_SYSCALL_TID
      flags |= BSON_CONTEXT_USE_TASK_ID;
#endif

      for (i = 0; i < N_THREADS; i++) {
         contexts[i] = bson_context_new (flags);
         bson_thread_create (&threads[i], oid_worker, contexts[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_context_destroy (contexts[i]);
      }
   }

   /*
    * Test threaded generation of oids using a single context;
    */
   {
      bson_thread_t threads[N_THREADS];

      context = bson_context_new (BSON_CONTEXT_THREAD_SAFE);

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_create (&threads[i], oid_worker, context);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      bson_context_destroy (context);
   }
}